

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::MapTextureSubresource
          (DeviceContextVkImpl *this,ITexture *pTexture,Uint32 MipLevel,Uint32 ArraySlice,
          MAP_TYPE MapType,MAP_FLAGS MapFlags,Box *pMapRegion,MappedTextureSubresource *MappedData)

{
  TextureDesc *TexDesc;
  Uint32 *pUVar1;
  USAGE Usage;
  Uint32 UVar2;
  Uint32 UVar3;
  VulkanPhysicalDevice *pVVar4;
  ulong uVar5;
  DeviceContextVkImpl *pDVar6;
  int iVar7;
  undefined4 extraout_var;
  TextureFormatAttribs *pTVar8;
  Uint64 UVar9;
  uint8_t *puVar10;
  uint Alignment;
  char (*Args_1) [56];
  ulong uVar11;
  char (*Args_1_00) [47];
  long lVar12;
  byte bVar13;
  _Alloc_hider _Var14;
  undefined7 in_register_00000081;
  char (*Args_2) [77];
  undefined7 in_register_00000089;
  char *Offset;
  uint uVar15;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>,_false,_false>,_bool>
  pVar16;
  Uint32 MipLevel_local;
  Uint32 ArraySlice_local;
  DeviceContextVkImpl *local_160;
  uint local_158;
  undefined4 local_154;
  TextureDesc *local_150;
  BufferToTextureCopyInfo CopyInfo;
  VulkanDynamicAllocation Allocation;
  string msg;
  undefined4 local_a8;
  undefined4 uStack_a4;
  Box FullExtentBox;
  
  MipLevel_local = MipLevel;
  ArraySlice_local = ArraySlice;
  if (pTexture == (ITexture *)0x0) {
    local_160 = this;
    FormatString<char[26]>(&msg,(char (*) [26])0x76baa1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"MapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x754);
    this = local_160;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,
                      CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                               msg.field_2._M_allocated_capacity._0_4_) + 1);
      this = local_160;
    }
  }
  uVar15 = (uint)CONCAT71(in_register_00000089,MapFlags);
  iVar7 = (*(pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])(pTexture);
  local_154 = (undefined4)CONCAT71(in_register_00000081,MapType);
  Args_1 = (char (*) [56])(ulong)MapType;
  local_158 = uVar15;
  ValidateMapTextureParams
            ((TextureDesc *)CONCAT44(extraout_var,iVar7),MipLevel,ArraySlice,MapType,uVar15 & 0xff,
             pMapRegion);
  pUVar1 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Stats.CommandCounters.
            MapTextureSubresource;
  *pUVar1 = *pUVar1 + 1;
  CheckDynamicType<Diligent::TextureVkImpl,Diligent::ITexture>(pTexture);
  TexDesc = (TextureDesc *)(pTexture + 3);
  pTVar8 = GetTextureFormatAttribs
                     (*(TEXTURE_FORMAT *)
                       &pTexture[6].super_IDeviceObject.super_IObject._vptr_IObject);
  FullExtentBox.MinX = 0;
  FullExtentBox.MaxX = 0;
  FullExtentBox.MinY = 0;
  FullExtentBox.MaxY = 0;
  FullExtentBox.MinZ = 0;
  FullExtentBox.MaxZ = 1;
  local_160 = (DeviceContextVkImpl *)pMapRegion;
  if (pMapRegion == (Box *)0x0) {
    GetMipLevelProperties((MipLevelProperties *)&msg,TexDesc,MipLevel_local);
    Args_1 = (char (*) [56])(ulong)msg._M_dataplus._M_p._4_4_;
    local_160 = (DeviceContextVkImpl *)&FullExtentBox;
    FullExtentBox.MaxX = (Uint32)msg._M_dataplus._M_p;
    FullExtentBox.MaxY = msg._M_dataplus._M_p._4_4_;
    FullExtentBox.MaxZ = msg.field_2._M_allocated_capacity._0_4_;
  }
  Usage = *(USAGE *)&pTexture[8].super_IDeviceObject.super_IObject._vptr_IObject;
  if (Usage == USAGE_STAGING) {
    Args_2 = (char (*) [77])0x0;
    UVar9 = GetStagingTextureLocationOffset(TexDesc,ArraySlice_local,MipLevel_local,0x10,0,0,0);
    local_150 = TexDesc;
    GetMipLevelProperties((MipLevelProperties *)&msg,TexDesc,MipLevel_local);
    pDVar6 = local_160;
    Args_1_00 = (char (*) [47])
                (((ulong)(msg._M_string_length._4_4_ * *(Uint32 *)((long)local_160 + 0x10) +
                         *(Uint32 *)((long)local_160 + 8)) / (ulong)pTVar8->BlockHeight) *
                CONCAT44(msg.field_2._12_4_,msg.field_2._8_4_));
    bVar13 = 1;
    if (pTVar8->ComponentType != COMPONENT_TYPE_COMPRESSED) {
      bVar13 = pTVar8->NumComponents;
    }
    Offset = *Args_1_00 +
             (ulong)bVar13 * (ulong)pTVar8->ComponentSize *
             ((ulong)*(uint *)&local_160->
                               super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits> /
             (ulong)pTVar8->BlockWidth) + UVar9;
    puVar10 = TextureVkImpl::GetStagingDataCPUAddress((TextureVkImpl *)pTexture);
    MappedData->pData = puVar10 + (long)Offset;
    MappedData->Stride = CONCAT44(msg.field_2._12_4_,msg.field_2._8_4_);
    MappedData->DepthStride = CONCAT44(uStack_a4,local_a8);
    if ((char)local_154 != '\x02') {
      if (MapType != MAP_READ) {
        return;
      }
      if ((local_158 & 1) == 0) {
        FormatString<char[208]>
                  ((string *)&CopyInfo,
                   (char (*) [208])
                   "Vulkan backend never waits for GPU when mapping staging textures for reading. Applications must use fences or other synchronization methods to explicitly synchronize access and use MAP_FLAG_DO_NOT_WAIT flag."
                  );
        if (DebugMessageCallback != (undefined *)0x0) {
          Args_1_00 = (char (*) [47])0x0;
          Args_2 = (char (*) [77])0x0;
          (*(code *)DebugMessageCallback)(1,CopyInfo.RowSize,0);
        }
        if ((Uint32 *)CopyInfo.RowSize != &CopyInfo.RowStrideInTexels) {
          operator_delete((void *)CopyInfo.RowSize,
                          CONCAT44(CopyInfo.RowCount,CopyInfo.RowStrideInTexels) + 1);
        }
      }
      if (((ulong)pTexture[8].super_IDeviceObject.super_IObject._vptr_IObject & 0x100) == 0) {
        FormatString<char[10],char_const*,char[76]>
                  ((string *)&CopyInfo,(Diligent *)0x769bff,(char (*) [10])local_150,
                   (char **)
                   "\' was not created with CPU_ACCESS_READ flag and can\'t be mapped for reading",
                   (char (*) [76])Args_2);
        Args_1_00 = (char (*) [47])0xac2;
        DebugAssertionFailed
                  ((Char *)CopyInfo.RowSize,"MapTextureSubresource",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xac2);
        if ((Uint32 *)CopyInfo.RowSize != &CopyInfo.RowStrideInTexels) {
          operator_delete((void *)CopyInfo.RowSize,
                          CONCAT44(CopyInfo.RowCount,CopyInfo.RowStrideInTexels) + 1);
        }
      }
      if ((*(Uint32 *)((long)pDVar6 + 0x14) == 0) || (*(Uint32 *)((long)pDVar6 + 0xc) == 0)) {
        FormatString<char[26],char[47]>
                  ((string *)&CopyInfo,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"pMapRegion->MaxZ >= 1 && pMapRegion->MaxY >= 1",Args_1_00);
        DebugAssertionFailed
                  ((Char *)CopyInfo.RowSize,"MapTextureSubresource",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xac5);
        if ((Uint32 *)CopyInfo.RowSize != &CopyInfo.RowStrideInTexels) {
          operator_delete((void *)CopyInfo.RowSize,
                          CONCAT44(CopyInfo.RowCount,CopyInfo.RowStrideInTexels) + 1);
        }
      }
      UVar2 = *(Uint32 *)((long)pDVar6 + 4);
      bVar13 = pTVar8->BlockWidth;
      Allocation.pDynamicMemMgr =
           (VulkanDynamicMemoryManager *)CONCAT44(Allocation.pDynamicMemMgr._4_4_,(uint)bVar13);
      if (((uint)bVar13 ^ bVar13 - 1) <= bVar13 - 1) {
        FormatString<char[12],unsigned_int,char[23]>
                  ((string *)&CopyInfo,(Diligent *)"Alignment (",(char (*) [12])&Allocation,
                   (uint *)") must be a power of 2",(char (*) [23])Args_2);
        DebugAssertionFailed
                  ((Char *)CopyInfo.RowSize,"AlignUp",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                   ,0x34);
        if ((Uint32 *)CopyInfo.RowSize != &CopyInfo.RowStrideInTexels) {
          operator_delete((void *)CopyInfo.RowSize,
                          CONCAT44(CopyInfo.RowCount,CopyInfo.RowStrideInTexels) + 1);
        }
      }
      iVar7 = (int)Allocation.pDynamicMemMgr;
      UVar3 = *(Uint32 *)((long)pDVar6 + 0xc);
      bVar13 = pTVar8->BlockHeight;
      Allocation.pDynamicMemMgr =
           (VulkanDynamicMemoryManager *)CONCAT44(Allocation.pDynamicMemMgr._4_4_,(uint)bVar13);
      if (((uint)bVar13 ^ bVar13 - 1) <= bVar13 - 1) {
        FormatString<char[12],unsigned_int,char[23]>
                  ((string *)&CopyInfo,(Diligent *)"Alignment (",(char (*) [12])&Allocation,
                   (uint *)") must be a power of 2",(char (*) [23])Args_2);
        DebugAssertionFailed
                  ((Char *)CopyInfo.RowSize,"AlignUp",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
                   ,0x34);
        if ((Uint32 *)CopyInfo.RowSize != &CopyInfo.RowStrideInTexels) {
          operator_delete((void *)CopyInfo.RowSize,
                          CONCAT44(CopyInfo.RowCount,CopyInfo.RowStrideInTexels) + 1);
        }
      }
      bVar13 = 1;
      if (pTVar8->ComponentType != COMPONENT_TYPE_COMPRESSED) {
        bVar13 = pTVar8->NumComponents;
      }
      TextureVkImpl::InvalidateStagingRange
                ((TextureVkImpl *)pTexture,(VkDeviceSize)Offset,
                 (UVar9 - (long)Offset) +
                 (ulong)bVar13 * (ulong)pTVar8->ComponentSize *
                 ((ulong)(-iVar7 & (UVar2 + iVar7) - 1) / (ulong)pTVar8->BlockWidth) +
                 ((ulong)(((*(Uint32 *)((long)local_160 + 0x14) - 1) * msg._M_string_length._4_4_ +
                          (-(int)Allocation.pDynamicMemMgr &
                          ((int)Allocation.pDynamicMemMgr + UVar3) - 1)) - (uint)pTVar8->BlockHeight
                         ) / (ulong)(uint)pTVar8->BlockHeight) *
                 CONCAT44(msg.field_2._12_4_,msg.field_2._8_4_));
      return;
    }
    if (((ulong)pTexture[8].super_IDeviceObject.super_IObject._vptr_IObject & 0x200) != 0) {
      return;
    }
    FormatString<char[10],char_const*,char[77]>
              ((string *)&CopyInfo,(Diligent *)0x769bff,(char (*) [10])local_150,
               (char **)
               "\' was not created with CPU_ACCESS_WRITE flag and can\'t be mapped for writing",
               Args_2);
    DebugAssertionFailed
              ((Char *)CopyInfo.RowSize,"MapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xacf);
    if ((Uint32 *)CopyInfo.RowSize == &CopyInfo.RowStrideInTexels) {
      return;
    }
    lVar12 = CONCAT44(CopyInfo.RowCount,CopyInfo.RowStrideInTexels);
    _Var14._M_p = (pointer)CopyInfo.RowSize;
  }
  else {
    if (Usage == USAGE_DYNAMIC) {
      if ((char)local_154 != '\x02') {
        LogError<false,char[66]>
                  (false,"MapTextureSubresource",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xa8b,(char (*) [66])
                          "Dynamic textures can be mapped for writing only in Vulkan backend");
        MappedData->pData = (PVoid)0x0;
        MappedData->Stride = 0;
        MappedData->DepthStride = 0;
        return;
      }
      local_150 = TexDesc;
      if (((local_158 & 6) != 0) &&
         (MapTextureSubresource(Diligent::ITexture*,unsigned_int,unsigned_int,Diligent::MAP_TYPE,Diligent::MAP_FLAGS,Diligent::Box_const*,Diligent::MappedTextureSubresource&)
          ::IsFirstTime == '\0')) {
        FormatString<char[102]>
                  (&msg,(char (*) [102])
                        "Mapping textures with flags MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE has no effect in Vulkan backend"
                  );
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                                   msg.field_2._M_allocated_capacity._0_4_) + 1);
        }
        MapTextureSubresource(Diligent::ITexture*,unsigned_int,unsigned_int,Diligent::MAP_TYPE,Diligent::MAP_FLAGS,Diligent::Box_const*,Diligent::MappedTextureSubresource&)
        ::IsFirstTime = '\x01';
      }
      pVVar4 = (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                 super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->
               m_PhysicalDevice)._M_t.
               super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
               ._M_t.
               super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
               .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
      GetBufferToTextureCopyInfo
                (&CopyInfo,
                 *(TEXTURE_FORMAT *)&pTexture[6].super_IDeviceObject.super_IObject._vptr_IObject,
                 (Box *)local_160,
                 (Uint32)(pVVar4->m_Properties).limits.optimalBufferCopyRowPitchAlignment);
      uVar5 = (pVVar4->m_Properties).limits.optimalBufferCopyOffsetAlignment;
      uVar11 = 4;
      if (4 < uVar5) {
        uVar11 = uVar5;
      }
      uVar15 = (uint)pTVar8->ComponentSize;
      if (pTVar8->ComponentSize < uVar11) {
        uVar15 = (uint)uVar11;
      }
      Alignment = (uint)uVar11;
      if (pTVar8->ComponentType == COMPONENT_TYPE_COMPRESSED) {
        Alignment = uVar15;
      }
      AllocateDynamicSpace
                (&Allocation,this,
                 CONCAT44(CopyInfo.MemorySize._4_4_,(undefined4)CopyInfo.MemorySize),Alignment);
      if (Allocation.pDynamicMemMgr == (VulkanDynamicMemoryManager *)0x0) {
        return;
      }
      MappedData->pData = (Allocation.pDynamicMemMgr)->m_CPUAddress + Allocation.AlignedOffset;
      MappedData->Stride = CopyInfo.RowStride;
      MappedData->DepthStride =
           CONCAT44(CopyInfo.DepthStride._4_4_,(undefined4)CopyInfo.DepthStride);
      msg.field_2._M_allocated_capacity._0_4_ = CopyInfo.RowStrideInTexels;
      msg.field_2._M_allocated_capacity._4_4_ = CopyInfo.RowCount;
      msg.field_2._8_4_ = (undefined4)CopyInfo.DepthStride;
      msg.field_2._12_4_ = CopyInfo.DepthStride._4_4_;
      msg._M_dataplus._M_p = (pointer)CopyInfo.RowSize;
      msg._M_string_length = CopyInfo.RowStride;
      Allocation.Size = 0;
      Allocation.dvpFrameNumber = 0;
      Allocation.pDynamicMemMgr = (VulkanDynamicMemoryManager *)0x0;
      Allocation.AlignedOffset = 0;
      pVar16 = std::
               _Hashtable<Diligent::DeviceContextVkImpl::MappedTextureKey,std::pair<Diligent::DeviceContextVkImpl::MappedTextureKey_const,Diligent::DeviceContextVkImpl::MappedTexture>,std::allocator<std::pair<Diligent::DeviceContextVkImpl::MappedTextureKey_const,Diligent::DeviceContextVkImpl::MappedTexture>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceContextVkImpl::MappedTextureKey>,Diligent::DeviceContextVkImpl::MappedTextureKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::
               _M_emplace<Diligent::DeviceContextVkImpl::MappedTextureKey,Diligent::DeviceContextVkImpl::MappedTexture>
                         ((_Hashtable<Diligent::DeviceContextVkImpl::MappedTextureKey,std::pair<Diligent::DeviceContextVkImpl::MappedTextureKey_const,Diligent::DeviceContextVkImpl::MappedTexture>,std::allocator<std::pair<Diligent::DeviceContextVkImpl::MappedTextureKey_const,Diligent::DeviceContextVkImpl::MappedTexture>>,std::__detail::_Select1st,std::equal_to<Diligent::DeviceContextVkImpl::MappedTextureKey>,Diligent::DeviceContextVkImpl::MappedTextureKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)&this->m_MappedTextures);
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return;
      }
      FormatString<char[11],unsigned_int,char[9],unsigned_int,char[14],char_const*,char[26]>
                (&msg,(Diligent *)"Mip level ",(char (*) [11])&MipLevel_local,(uint *)", slice ",
                 (char (*) [9])&ArraySlice_local,(uint *)0x6db112,(char (*) [14])local_150,
                 (char **)"\' has already been mapped",
                 (char (*) [26])CONCAT44(ArraySlice_local,MipLevel_local));
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
    }
    else {
      CopyInfo.RowSize = (Uint64)GetUsageString(Usage);
      FormatString<char_const*,char[56]>
                (&msg,(Diligent *)&CopyInfo,
                 (char **)" textures cannot currently be mapped in Vulkan back-end",Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"MapTextureSubresource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xad5);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p == &msg.field_2) {
      return;
    }
    lVar12 = CONCAT44(msg.field_2._M_allocated_capacity._4_4_,
                      msg.field_2._M_allocated_capacity._0_4_);
    _Var14._M_p = msg._M_dataplus._M_p;
  }
  operator_delete(_Var14._M_p,lVar12 + 1);
  return;
}

Assistant:

void DeviceContextVkImpl::MapTextureSubresource(ITexture*                 pTexture,
                                                Uint32                    MipLevel,
                                                Uint32                    ArraySlice,
                                                MAP_TYPE                  MapType,
                                                MAP_FLAGS                 MapFlags,
                                                const Box*                pMapRegion,
                                                MappedTextureSubresource& MappedData)
{
    TDeviceContextBase::MapTextureSubresource(pTexture, MipLevel, ArraySlice, MapType, MapFlags, pMapRegion, MappedData);

    TextureVkImpl&              TextureVk  = *ClassPtrCast<TextureVkImpl>(pTexture);
    const TextureDesc&          TexDesc    = TextureVk.GetDesc();
    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);

    Box FullExtentBox;
    if (pMapRegion == nullptr)
    {
        MipLevelProperties MipLevelAttribs = GetMipLevelProperties(TexDesc, MipLevel);

        FullExtentBox.MaxX = MipLevelAttribs.LogicalWidth;
        FullExtentBox.MaxY = MipLevelAttribs.LogicalHeight;
        FullExtentBox.MaxZ = MipLevelAttribs.Depth;
        pMapRegion         = &FullExtentBox;
    }

    if (TexDesc.Usage == USAGE_DYNAMIC)
    {
        if (MapType != MAP_WRITE)
        {
            LOG_ERROR("Dynamic textures can be mapped for writing only in Vulkan backend");
            MappedData = MappedTextureSubresource{};
            return;
        }

        if ((MapFlags & (MAP_FLAG_DISCARD | MAP_FLAG_NO_OVERWRITE)) != 0)
            LOG_INFO_MESSAGE_ONCE("Mapping textures with flags MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE has no effect in Vulkan backend");

        const VkPhysicalDeviceLimits& DeviceLimits = m_pDevice->GetPhysicalDevice().GetProperties().limits;
        const BufferToTextureCopyInfo CopyInfo     = GetBufferToTextureCopyInfo(TexDesc.Format, *pMapRegion, static_cast<Uint32>(DeviceLimits.optimalBufferCopyRowPitchAlignment));
        // Source buffer offset must be multiple of 4 (18.4)
        VkDeviceSize Alignment = std::max(DeviceLimits.optimalBufferCopyOffsetAlignment, VkDeviceSize{4});
        // If the calling command's VkImage parameter is a compressed image, bufferOffset must be a multiple of
        // the compressed texel block size in bytes (18.4)
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
        {
            Alignment = std::max(Alignment, VkDeviceSize{FmtAttribs.ComponentSize});
        }
        if (VulkanDynamicAllocation Allocation = AllocateDynamicSpace(CopyInfo.MemorySize, static_cast<Uint32>(Alignment)))
        {
            MappedData.pData       = reinterpret_cast<Uint8*>(Allocation.pDynamicMemMgr->GetCPUAddress()) + Allocation.AlignedOffset;
            MappedData.Stride      = CopyInfo.RowStride;
            MappedData.DepthStride = CopyInfo.DepthStride;

            auto it = m_MappedTextures.emplace(MappedTextureKey{&TextureVk, MipLevel, ArraySlice}, MappedTexture{CopyInfo, std::move(Allocation)});
            if (!it.second)
                LOG_ERROR_MESSAGE("Mip level ", MipLevel, ", slice ", ArraySlice, " of texture '", TexDesc.Name, "' has already been mapped");
        }
    }
    else if (TexDesc.Usage == USAGE_STAGING)
    {
        Uint64 SubresourceOffset =
            GetStagingTextureSubresourceOffset(TexDesc, ArraySlice, MipLevel, TextureVkImpl::StagingBufferOffsetAlignment);
        const MipLevelProperties MipLevelAttribs = GetMipLevelProperties(TexDesc, MipLevel);
        // address of (x,y,z) = region->bufferOffset + (((z * imageHeight) + y) * rowLength + x) * texelBlockSize; (18.4.1)
        Uint64 MapStartOffset = SubresourceOffset +
            // For compressed-block formats, RowSize is the size of one compressed row.
            // For non-compressed formats, BlockHeight is 1.
            (pMapRegion->MinZ * MipLevelAttribs.StorageHeight + pMapRegion->MinY) / FmtAttribs.BlockHeight * MipLevelAttribs.RowSize +
            // For non-compressed formats, BlockWidth is 1.
            pMapRegion->MinX / FmtAttribs.BlockWidth * Uint64{FmtAttribs.GetElementSize()};

        MappedData.pData       = TextureVk.GetStagingDataCPUAddress() + MapStartOffset;
        MappedData.Stride      = MipLevelAttribs.RowSize;
        MappedData.DepthStride = MipLevelAttribs.DepthSliceSize;

        if (MapType == MAP_READ)
        {
            if ((MapFlags & MAP_FLAG_DO_NOT_WAIT) == 0)
            {
                LOG_WARNING_MESSAGE("Vulkan backend never waits for GPU when mapping staging textures for reading. "
                                    "Applications must use fences or other synchronization methods to explicitly synchronize "
                                    "access and use MAP_FLAG_DO_NOT_WAIT flag.");
            }

            DEV_CHECK_ERR((TexDesc.CPUAccessFlags & CPU_ACCESS_READ), "Texture '", TexDesc.Name, "' was not created with CPU_ACCESS_READ flag and can't be mapped for reading");
            // Readback memory is not created with HOST_COHERENT flag, so we have to explicitly invalidate the mapped range
            // to make device writes visible to CPU reads
            VERIFY_EXPR(pMapRegion->MaxZ >= 1 && pMapRegion->MaxY >= 1);
            Uint32 BlockAlignedMaxX = AlignUp(pMapRegion->MaxX, Uint32{FmtAttribs.BlockWidth});
            Uint32 BlockAlignedMaxY = AlignUp(pMapRegion->MaxY, Uint32{FmtAttribs.BlockHeight});
            Uint64 MapEndOffset     = SubresourceOffset +
                ((pMapRegion->MaxZ - 1) * MipLevelAttribs.StorageHeight + (BlockAlignedMaxY - FmtAttribs.BlockHeight)) / FmtAttribs.BlockHeight * MipLevelAttribs.RowSize +
                (BlockAlignedMaxX / FmtAttribs.BlockWidth) * Uint64{FmtAttribs.GetElementSize()};
            TextureVk.InvalidateStagingRange(MapStartOffset, MapEndOffset - MapStartOffset);
        }
        else if (MapType == MAP_WRITE)
        {
            DEV_CHECK_ERR((TexDesc.CPUAccessFlags & CPU_ACCESS_WRITE), "Texture '", TexDesc.Name, "' was not created with CPU_ACCESS_WRITE flag and can't be mapped for writing");
            // Nothing needs to be done when mapping texture for writing
        }
    }
    else
    {
        UNSUPPORTED(GetUsageString(TexDesc.Usage), " textures cannot currently be mapped in Vulkan back-end");
    }
}